

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O3

void error_handler_new(exr_const_context_t file,int code,char *msg)

{
  char *in_RAX;
  size_t sVar1;
  ostream *poVar2;
  char *fn;
  char *local_28;
  
  local_28 = in_RAX;
  exr_get_file_name(file,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Core EXR ERROR:",0xf);
  if (file != (exr_const_context_t)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \'",2);
    if (local_28 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1092a0);
    }
    else {
      sVar1 = strlen(local_28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_28,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,code);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,msg,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

static void
error_handler_new (exr_const_context_t file, int code, const char* msg)
{
    const char* fn;
    exr_get_file_name (file, &fn);
    std::cerr << "Core EXR ERROR:";
    if (file) std::cerr << " '" << fn << "'";
    std::cerr << " (" << code << "): " << msg << std::endl;
}